

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::WriteCueTime(FILE *f,mkvtime_t time_ns)

{
  int iVar1;
  
  if ((3599999999999 < time_ns) &&
     (iVar1 = fprintf((FILE *)f,"%02lld:",time_ns / 3600000000000), iVar1 < 0)) {
    return false;
  }
  iVar1 = fprintf((FILE *)f,"%02lld:%02lld.%03lld",
                  (time_ns / 3600000000000) * -0x3c + time_ns / 60000000000,
                  (time_ns / 60000000000) * -0x3c + time_ns / 1000000000,
                  (time_ns / 1000000000) * -1000 + time_ns / 1000000);
  return -1 < iVar1;
}

Assistant:

bool vttdemux::WriteCueTime(FILE* f, mkvtime_t time_ns) {
  mkvtime_t ms = time_ns / 1000000;  // WebVTT time has millisecond resolution

  mkvtime_t sec = ms / 1000;
  ms -= sec * 1000;

  mkvtime_t min = sec / 60;
  sec -= 60 * min;

  mkvtime_t hr = min / 60;
  min -= 60 * hr;

  if (hr > 0) {
    if (fprintf(f, "%02lld:", hr) < 0)
      return false;
  }

  if (fprintf(f, "%02lld:%02lld.%03lld", min, sec, ms) < 0)
    return false;

  return true;
}